

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
EncodedDescriptorDatabaseExtraTest_FindNameOfFileContainingSymbol_Test::TestBody
          (EncodedDescriptorDatabaseExtraTest_FindNameOfFileContainingSymbol_Test *this)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  void *pvVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  ulong uVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string filename;
  EncodedDescriptorDatabase db;
  string data2;
  string data1;
  FileDescriptorProto file1;
  FileDescriptorProto file2b;
  FileDescriptorProto file2a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3d0;
  AssertHelper local_3c8;
  undefined1 local_3c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  Message local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  string local_390;
  undefined1 local_370 [40];
  long *local_348;
  undefined8 local_340;
  long local_338;
  undefined8 uStack_330;
  string local_328;
  undefined1 local_308 [200];
  ArenaStringPtr local_240;
  ArenaStringPtr local_238 [5];
  undefined1 local_210 [208];
  ArenaStringPtr local_140 [5];
  undefined1 local_118 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_308,(Arena *)0x0);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_118,(Arena *)0x0);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_210,(Arena *)0x0);
  local_308[0x10] = local_308[0x10] | 1;
  pAVar6 = (Arena *)local_308._8_8_;
  if ((local_308._8_8_ & 1) != 0) {
    pAVar6 = *(Arena **)(local_308._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_240,value,pAVar6);
  local_308[0x10] = local_308[0x10] | 2;
  if ((local_308._8_8_ & 1) != 0) {
    local_308._8_8_ = *(undefined8 *)(local_308._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_238,value_00,(Arena *)local_308._8_8_);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_308 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar4 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_01._M_str = "Foo";
  value_01._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar4 + 0xd8),value_01,pAVar6);
  local_118[0x10] = local_118[0x10] | 1;
  if ((local_118._8_8_ & 1) != 0) {
    local_118._8_8_ = *(undefined8 *)(local_118._8_8_ & 0xfffffffffffffffe);
  }
  value_02._M_str = "bar.proto";
  value_02._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_118 + 200),value_02,(Arena *)local_118._8_8_);
  local_210[0x10] = local_210[0x10] | 2;
  if ((local_210._8_8_ & 1) != 0) {
    local_210._8_8_ = *(undefined8 *)(local_210._8_8_ & 0xfffffffffffffffe);
  }
  value_03._M_str = "bar";
  value_03._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set(local_140,value_03,(Arena *)local_210._8_8_);
  pvVar4 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_210 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar4 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_04._M_str = "Bar";
  value_04._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar4 + 0xd8),value_04,pAVar6);
  MessageLite::SerializeAsString_abi_cxx11_(&local_328,(MessageLite *)local_308);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_370,(MessageLite *)local_210);
  MessageLite::SerializeAsString_abi_cxx11_(&local_390,(MessageLite *)local_118);
  uVar7 = 0xf;
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    uVar7 = local_370._16_8_;
  }
  if (uVar7 < local_390._M_string_length + local_370._8_8_) {
    in_R9 = &local_390.field_2;
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != in_R9) {
      uVar7 = CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                       local_390.field_2._M_local_buf[0]);
    }
    if (uVar7 < local_390._M_string_length + local_370._8_8_) goto LAB_0055f1f4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,local_370._0_8_);
  }
  else {
LAB_0055f1f4:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append(local_370,(ulong)local_390._M_dataplus._M_p);
  }
  local_348 = &local_338;
  plVar1 = puVar5 + 2;
  if ((long *)*puVar5 == plVar1) {
    local_338 = *plVar1;
    uStack_330 = puVar5[3];
  }
  else {
    local_338 = *plVar1;
    local_348 = (long *)*puVar5;
  }
  local_340 = puVar5[1];
  *puVar5 = plVar1;
  puVar5[1] = 0;
  *(undefined1 *)plVar1 = 0;
  paVar2 = &local_390.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
  }
  EncodedDescriptorDatabase::EncodedDescriptorDatabase((EncodedDescriptorDatabase *)local_370);
  EncodedDescriptorDatabase::Add
            ((EncodedDescriptorDatabase *)local_370,local_328._M_dataplus._M_p,
             (int)local_328._M_string_length);
  EncodedDescriptorDatabase::Add((EncodedDescriptorDatabase *)local_370,local_348,(int)local_340);
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_3c0 = (undefined1  [8])&local_3b0;
  local_390._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"foo.Foo","");
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                 ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (!(bool)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_0055f353;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_0055f353:
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3c0,(internal *)&local_3a0,
                 (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo.Foo\", &filename)",
                 "false","true",in_R9->_M_local_buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x1e0,(char *)local_3c0);
      testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
      }
      if (local_3d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
      }
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_3c0,"\"foo.proto\"","filename",(char (*) [10])0x119907e,&local_390);
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_3b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_3b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e1,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
    if ((long *)CONCAT71(local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b8,local_3b8);
  }
  local_3c0 = (undefined1  [8])&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"foo.Foo.Blah","");
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                 ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (!(bool)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_0055f500;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_0055f500:
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3c0,(internal *)&local_3a0,
                 (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo.Foo.Blah\", &filename)"
                 ,"false","true",in_R9->_M_local_buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x1e2,(char *)local_3c0);
      testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
      }
      if (local_3d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
      }
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_3c0,"\"foo.proto\"","filename",(char (*) [10])0x119907e,&local_390);
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_3b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_3b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e3,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
    if ((long *)CONCAT71(local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b8,local_3b8);
  }
  local_3c0 = (undefined1  [8])&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"bar.Bar","");
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (internal)
       EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                 ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (!(bool)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) goto LAB_0055f6ad;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_0055f6ad:
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3c0,(internal *)&local_3a0,
                 (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"bar.Bar\", &filename)",
                 "false","true",in_R9->_M_local_buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x1e4,(char *)local_3c0);
      testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
      }
      if (local_3d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
      }
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_3c0,"\"bar.proto\"","filename",(char (*) [10])0x119946a,&local_390);
  if (local_3c0[0] == (string)0x0) {
    testing::Message::Message(&local_3a0);
    if (local_3b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar8 = (local_3b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e5,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d0,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
    if ((long *)CONCAT71(local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_3b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b8,local_3b8);
  }
  local_3c0 = (undefined1  [8])&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"foo","");
  bVar3 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar3;
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (bVar3) goto LAB_0055f85f;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_0055f85f:
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3c0,(internal *)&local_3a0,
                 (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo\", &filename)","true",
                 "false",in_R9->_M_local_buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x1e6,(char *)local_3c0);
      testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
      }
      if (local_3d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
      }
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  local_3c0 = (undefined1  [8])&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"bar","");
  bVar3 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar3;
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (bVar3) goto LAB_0055f96e;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) == 0) {
LAB_0055f96e:
      testing::Message::Message((Message *)&local_3d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3c0,(internal *)&local_3a0,
                 (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"bar\", &filename)","true",
                 "false",in_R9->_M_local_buf);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x1e7,(char *)local_3c0);
      testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      if (local_3c0 != (undefined1  [8])&local_3b0) {
        operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
      }
      if (local_3d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
      }
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  local_3c0 = (undefined1  [8])&local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"baz.Baz","");
  bVar3 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)local_370,(StringViewArg)local_3c0,&local_390);
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar3;
  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_3c0 == (undefined1  [8])&local_3b0) {
    if (!bVar3) goto LAB_0055fb0b;
  }
  else {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
    if (((byte)local_3a0.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_ & 1) != 0) goto LAB_0055fb0b;
  }
  testing::Message::Message((Message *)&local_3d0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_3c0,(internal *)&local_3a0,
             (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"baz.Baz\", &filename)","true",
             "false",in_R9->_M_local_buf);
  testing::internal::AssertHelper::AssertHelper
            (&local_3c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,0x1e8,(char *)local_3c0);
  testing::internal::AssertHelper::operator=(&local_3c8,(Message *)&local_3d0);
  testing::internal::AssertHelper::~AssertHelper(&local_3c8);
  if (local_3c0 != (undefined1  [8])&local_3b0) {
    operator_delete((void *)local_3c0,local_3b0._M_allocated_capacity + 1);
  }
  if (local_3d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_3d0._M_head_impl + 8))();
  }
LAB_0055fb0b:
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  EncodedDescriptorDatabase::~EncodedDescriptorDatabase((EncodedDescriptorDatabase *)local_370);
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_210);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_118);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_308);
  return;
}

Assistant:

TEST(EncodedDescriptorDatabaseExtraTest, FindNameOfFileContainingSymbol) {
  // Create two files, one of which is in two parts.
  FileDescriptorProto file1, file2a, file2b;
  file1.set_name("foo.proto");
  file1.set_package("foo");
  file1.add_message_type()->set_name("Foo");
  file2a.set_name("bar.proto");
  file2b.set_package("bar");
  file2b.add_message_type()->set_name("Bar");

  // Normal serialization allows our optimization to kick in.
  std::string data1 = file1.SerializeAsString();

  // Force out-of-order serialization to test slow path.
  std::string data2 = file2b.SerializeAsString() + file2a.SerializeAsString();

  // Create EncodedDescriptorDatabase containing both files.
  EncodedDescriptorDatabase db;
  db.Add(data1.data(), data1.size());
  db.Add(data2.data(), data2.size());

  // Test!
  std::string filename;
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo.Blah", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("bar.Bar", &filename));
  EXPECT_EQ("bar.proto", filename);
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("foo", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("bar", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("baz.Baz", &filename));
}